

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O2

void Qentem::Memory::Swap<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
               (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item1,
               HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item2)

{
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> item;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> HStack_48;
  
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::HAItem_T(&HStack_48,item1);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator=(item1,item2);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator=(item2,&HStack_48);
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::~HAItem_T(&HStack_48);
  return;
}

Assistant:

inline static void Swap(Type_T &item1, Type_T &item2) noexcept {
    Type_T item = Move(item1);
    item1       = Move(item2);
    item2       = Move(item);
}